

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

void uv__fs_post(uv_loop_t *loop,uv_fs_t *req)

{
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  (loop->active_reqs).count = (loop->active_reqs).count + 1;
  uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
  return;
}

Assistant:

void uv__fs_post(uv_loop_t* loop, uv_fs_t* req) {
  uv__req_register(loop, req);
  uv__work_submit(loop,
                  &req->work_req,
                  UV__WORK_FAST_IO,
                  uv__fs_work,
                  uv__fs_done);
}